

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

Type wasm::Type::get(uint byteSize,bool float_)

{
  BasicType BVar1;
  bool float__local;
  Type TStack_10;
  uint byteSize_local;
  
  if (byteSize < 4) {
    Type(&stack0xfffffffffffffff0,i32);
  }
  else if (byteSize == 4) {
    BVar1 = i32;
    if (float_) {
      BVar1 = f32;
    }
    Type(&stack0xfffffffffffffff0,BVar1);
  }
  else if (byteSize == 8) {
    BVar1 = i64;
    if (float_) {
      BVar1 = f64;
    }
    Type(&stack0xfffffffffffffff0,BVar1);
  }
  else {
    if (byteSize != 0x10) {
      handle_unreachable("invalid size",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x2e9);
    }
    Type(&stack0xfffffffffffffff0,v128);
  }
  return (Type)TStack_10.id;
}

Assistant:

Type Type::get(unsigned byteSize, bool float_) {
  if (byteSize < 4) {
    return Type::i32;
  }
  if (byteSize == 4) {
    return float_ ? Type::f32 : Type::i32;
  }
  if (byteSize == 8) {
    return float_ ? Type::f64 : Type::i64;
  }
  if (byteSize == 16) {
    return Type::v128;
  }
  WASM_UNREACHABLE("invalid size");
}